

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void list_client_accounts(int client_id)

{
  long *plVar1;
  Account account;
  ifstream inFile;
  Account local_240;
  long local_220 [4];
  byte abStack_200 [488];
  
  local_240._vptr_Account = (_func_int **)&PTR_create_account_00107c80;
  std::ifstream::ifstream(local_220);
  std::ifstream::open((char *)local_220,0x10513d);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n\n\t\tACCOUNT HOLDER LIST\n\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Account no.\t\tClient id\t\t\t\tClient Class\t\t\t\tAccount Type\t\t     Balance\n\n"
               ,0x46);
    while( true ) {
      plVar1 = (long *)std::istream::read((char *)local_220,(long)&local_240);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
      if (local_240.client_id == client_id) {
        Account::account_data_in_tabular_format(&local_240);
      }
    }
    std::ifstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"File could not be open !! Press any Key...",0x2a);
  }
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void list_client_accounts(int client_id)
{
    /*!
     * It is a helper function that helps to show the list of accounts
     * that's owned by the client and created in the banking system.
     * To do that it reads data from Account.dat and it uses
     * Account.get_client_id & Account::account_data_in_tabular_format
     * to accomplish its task
     */
    Account account;
    std::ifstream inFile;
    inFile.open("Account.dat",std::ios::binary);
    if(!inFile)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    std::cout<<"\n\n\t\tACCOUNT HOLDER LIST\n\n";

    std::cout<<"Account no.\t\tClient id\t\t\t\tClient Class\t\t\t\tAccount Type\t\t     Balance\n\n";

    while(inFile.read((char *) &account, sizeof(Account)))
    {
        if (account.get_client_id() == client_id){
            account.account_data_in_tabular_format();
        }

    }
    inFile.close();
}